

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O3

Buffer __thiscall nvim::Nvim::get_current_buf(Nvim *this)

{
  Buffer res;
  Buffer local_40;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"nvim_get_current_buf","");
  NvimRPC::call<>(&this->client_,&local_38,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return local_40;
}

Assistant:

Buffer Nvim::get_current_buf() {
    Buffer res;
    client_.call("nvim_get_current_buf", res);
    return res;
}